

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O1

_Bool al_set_audio_stream_channel_matrix(ALLEGRO_AUDIO_STREAM *stream,float *matrix)

{
  ALLEGRO_MIXER *pAVar1;
  size_t sVar2;
  size_t sVar3;
  _Bool _Var4;
  
  if (((stream->spl).parent.u.mixer != (ALLEGRO_MIXER *)0x0) &&
     ((stream->spl).parent.is_voice == true)) {
    _al_set_error(0xff,"Could not set channel matrix of stream attached to voice");
    return false;
  }
  pAVar1 = (stream->spl).parent.u.mixer;
  _Var4 = true;
  if (pAVar1 != (ALLEGRO_MIXER *)0x0) {
    if ((stream->spl).parent.is_voice == true) {
      _al_set_error(0xff,"Could not set channel matrix of sample attached to voice");
      _Var4 = false;
    }
    else if (pAVar1 != (ALLEGRO_MIXER *)0x0) {
      sVar2 = al_get_channel_count((pAVar1->ss).spl_data.chan_conf);
      sVar3 = al_get_channel_count((stream->spl).spl_data.chan_conf);
      if ((stream->spl).mutex != (ALLEGRO_MUTEX *)0x0) {
        al_lock_mutex();
      }
      memcpy((stream->spl).matrix,matrix,sVar2 * sVar3 * 4);
      if ((stream->spl).mutex != (ALLEGRO_MUTEX *)0x0) {
        al_unlock_mutex();
      }
    }
  }
  return _Var4;
}

Assistant:

bool al_set_audio_stream_channel_matrix(ALLEGRO_AUDIO_STREAM *stream, const float *matrix)
{
   ASSERT(stream);

   if (stream->spl.parent.u.ptr && stream->spl.parent.is_voice) {
      _al_set_error(ALLEGRO_GENERIC_ERROR,
         "Could not set channel matrix of stream attached to voice");
      return false;
   }

   return al_set_sample_instance_channel_matrix(&stream->spl, matrix);
}